

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  int iVar233;
  ulong uVar234;
  ulong uVar235;
  ulong uVar236;
  ulong uVar237;
  ulong uVar238;
  uint64_t tmp3;
  int overflow;
  uint64_t tmp2;
  secp256k1_scalar s;
  uchar buf [32];
  secp256k1_scalar e;
  secp256k1_fe rx;
  secp256k1_ge pk;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_gej pkj;
  secp256k1_ge pre_a [8];
  int local_a64;
  secp256k1_strauss_state local_a60;
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  secp256k1_scalar local_a28;
  uchar local_a08 [32];
  secp256k1_gej local_9e8;
  secp256k1_scalar local_968;
  secp256k1_fe local_948;
  secp256k1_ge local_920;
  secp256k1_fe local_8c8 [8];
  undefined1 local_788 [48];
  ulong uStack_758;
  ulong local_750;
  ulong uStack_748;
  uint64_t local_740;
  int local_738;
  undefined1 local_378 [104];
  undefined1 local_310 [16];
  int local_300;
  secp256k1_ge local_2f8 [8];
  
  if (sig64 == (uchar *)0x0) {
    secp256k1_schnorrsig_verify_cold_3();
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
      secp256k1_schnorrsig_verify_cold_1();
    }
    else {
      secp256k1_fe_impl_set_b32_mod(&local_948,sig64);
      if (((0xffffefffffc2e < local_948.n[0]) && (local_948.n[4] == 0xffffffffffff)) &&
         ((local_948.n[3] & local_948.n[1] & local_948.n[2]) == 0xfffffffffffff)) {
        return 0;
      }
      local_a48 = local_948.n[0];
      uStack_a40 = local_948.n[1];
      local_a38 = local_948.n[2];
      uStack_a30 = local_948.n[3];
      secp256k1_scalar_set_b32(&local_a28,sig64 + 0x20,&local_a64);
      if ((local_a64 == 0) &&
         (iVar233 = secp256k1_pubkey_load(ctx,&local_920,(secp256k1_pubkey *)pubkey), iVar233 != 0))
      {
        secp256k1_fe_impl_get_b32(local_a08,&local_920.x);
        secp256k1_schnorrsig_challenge(&local_968,sig64,msg,msglen,local_a08);
        secp256k1_scalar_negate(&local_968,&local_968);
        local_300 = local_920.infinity;
        local_378._0_8_ = local_920.x.n[0];
        local_378._8_8_ = local_920.x.n[1];
        local_378._16_8_ = local_920.x.n[2];
        local_378._24_8_ = local_920.x.n[3];
        local_378._32_8_ = local_920.x.n[4];
        local_378._40_8_ = local_920.y.n[0];
        local_378._48_8_ = local_920.y.n[1];
        local_378._56_8_ = local_920.y.n[2];
        local_378._64_8_ = local_920.y.n[3];
        local_378._72_8_ = local_920.y.n[4];
        local_378._80_8_ = 1;
        local_378._88_16_ = (undefined1  [16])0x0;
        local_310 = (undefined1  [16])0x0;
        local_a60.aux = local_8c8;
        local_a60.pre_a = local_2f8;
        local_a60.ps = (secp256k1_strauss_point_state *)local_788;
        secp256k1_ecmult_strauss_wnaf
                  (&local_a60,&local_9e8,1,(secp256k1_gej *)local_378,&local_968,&local_a28);
        if (local_9e8.infinity == 0) {
          secp256k1_fe_impl_inv_var(&local_9e8.z,&local_9e8.z);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_9e8.z.n[0] * 2;
          auVar111._8_8_ = 0;
          auVar111._0_8_ = local_9e8.z.n[3];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_9e8.z.n[1] * 2;
          auVar112._8_8_ = 0;
          auVar112._0_8_ = local_9e8.z.n[2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_9e8.z.n[4];
          auVar113._8_8_ = 0;
          auVar113._0_8_ = local_9e8.z.n[4];
          uVar234 = SUB168(auVar3 * auVar113,0);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar234 & 0xfffffffffffff;
          auVar1 = auVar2 * auVar112 + auVar1 * auVar111 + auVar4 * ZEXT816(0x1000003d10);
          uVar235 = auVar1._0_8_;
          auVar205._8_8_ = 0;
          auVar205._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          uVar237 = local_9e8.z.n[4] * 2;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_9e8.z.n[0];
          auVar114._8_8_ = 0;
          auVar114._0_8_ = uVar237;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_9e8.z.n[1] * 2;
          auVar115._8_8_ = 0;
          auVar115._0_8_ = local_9e8.z.n[3];
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_9e8.z.n[2];
          auVar116._8_8_ = 0;
          auVar116._0_8_ = local_9e8.z.n[2];
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar234 >> 0x34 | SUB168(auVar3 * auVar113,8) << 0xc;
          auVar1 = auVar5 * auVar114 + auVar205 + auVar6 * auVar115 + auVar7 * auVar116 +
                   auVar8 * ZEXT816(0x1000003d10);
          uVar234 = auVar1._0_8_;
          auVar206._8_8_ = 0;
          auVar206._0_8_ = uVar234 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_9e8.z.n[0];
          auVar117._8_8_ = 0;
          auVar117._0_8_ = local_9e8.z.n[0];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_9e8.z.n[1];
          auVar118._8_8_ = 0;
          auVar118._0_8_ = uVar237;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_9e8.z.n[2] * 2;
          auVar119._8_8_ = 0;
          auVar119._0_8_ = local_9e8.z.n[3];
          auVar1 = auVar10 * auVar118 + auVar206 + auVar11 * auVar119;
          uVar236 = auVar1._0_8_;
          auVar208._8_8_ = 0;
          auVar208._0_8_ = uVar236 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar120._8_8_ = 0;
          auVar120._0_8_ = (uVar236 & 0xfffffffffffff) << 4 | (uVar234 & 0xfffffffffffff) >> 0x30;
          auVar1 = auVar9 * auVar117 + ZEXT816(0x1000003d1) * auVar120;
          uVar236 = auVar1._0_8_;
          local_2f8[0].x.n[0] = uVar236 & 0xfffffffffffff;
          auVar207._8_8_ = 0;
          auVar207._0_8_ = uVar236 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_9e8.z.n[0] * 2;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = local_9e8.z.n[1];
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_9e8.z.n[2];
          auVar122._8_8_ = 0;
          auVar122._0_8_ = uVar237;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_9e8.z.n[3];
          auVar123._8_8_ = 0;
          auVar123._0_8_ = local_9e8.z.n[3];
          auVar2 = auVar13 * auVar122 + auVar208 + auVar14 * auVar123;
          uVar236 = auVar2._0_8_;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar236 & 0xfffffffffffff;
          auVar1 = auVar12 * auVar121 + auVar207 + auVar15 * ZEXT816(0x1000003d10);
          uVar238 = auVar1._0_8_;
          auVar210._8_8_ = 0;
          auVar210._0_8_ = uVar236 >> 0x34 | auVar2._8_8_ << 0xc;
          local_2f8[0].x.n[1] = uVar238 & 0xfffffffffffff;
          auVar209._8_8_ = 0;
          auVar209._0_8_ = uVar238 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_9e8.z.n[0] * 2;
          auVar124._8_8_ = 0;
          auVar124._0_8_ = local_9e8.z.n[2];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_9e8.z.n[1];
          auVar125._8_8_ = 0;
          auVar125._0_8_ = local_9e8.z.n[1];
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_9e8.z.n[3];
          auVar126._8_8_ = 0;
          auVar126._0_8_ = uVar237;
          auVar210 = auVar18 * auVar126 + auVar210;
          uVar237 = auVar210._0_8_;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = uVar237 & 0xfffffffffffff;
          auVar1 = auVar16 * auVar124 + auVar209 + auVar17 * auVar125 +
                   auVar19 * ZEXT816(0x1000003d10);
          uVar236 = auVar1._0_8_;
          local_2f8[0].x.n[2] = uVar236 & 0xfffffffffffff;
          auVar211._8_8_ = 0;
          auVar211._0_8_ = (uVar236 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar235 & 0xfffffffffffff);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar237 >> 0x34 | auVar210._8_8_ << 0xc;
          auVar211 = auVar20 * ZEXT816(0x1000003d10) + auVar211;
          uVar237 = auVar211._0_8_;
          local_2f8[0].x.n[3] = uVar237 & 0xfffffffffffff;
          local_2f8[0].x.n[4] =
               (uVar237 >> 0x34 | auVar211._8_8_ << 0xc) + (uVar234 & 0xffffffffffff);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_2f8[0].x.n[0];
          auVar127._8_8_ = 0;
          auVar127._0_8_ = local_9e8.z.n[3];
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_2f8[0].x.n[1];
          auVar128._8_8_ = 0;
          auVar128._0_8_ = local_9e8.z.n[2];
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_2f8[0].x.n[2];
          auVar129._8_8_ = 0;
          auVar129._0_8_ = local_9e8.z.n[1];
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_2f8[0].x.n[3];
          auVar130._8_8_ = 0;
          auVar130._0_8_ = local_9e8.z.n[0];
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_2f8[0].x.n[4];
          auVar131._8_8_ = 0;
          auVar131._0_8_ = local_9e8.z.n[4];
          uVar237 = SUB168(auVar25 * auVar131,0);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar237 & 0xfffffffffffff;
          auVar1 = auVar22 * auVar128 + auVar21 * auVar127 + auVar23 * auVar129 + auVar24 * auVar130
                   + auVar26 * ZEXT816(0x1000003d10);
          uVar234 = auVar1._0_8_;
          auVar212._8_8_ = 0;
          auVar212._0_8_ = uVar234 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_2f8[0].x.n[0];
          auVar132._8_8_ = 0;
          auVar132._0_8_ = local_9e8.z.n[4];
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_2f8[0].x.n[1];
          auVar133._8_8_ = 0;
          auVar133._0_8_ = local_9e8.z.n[3];
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_2f8[0].x.n[2];
          auVar134._8_8_ = 0;
          auVar134._0_8_ = local_9e8.z.n[2];
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_2f8[0].x.n[3];
          auVar135._8_8_ = 0;
          auVar135._0_8_ = local_9e8.z.n[1];
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_2f8[0].x.n[4];
          auVar136._8_8_ = 0;
          auVar136._0_8_ = local_9e8.z.n[0];
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar237 >> 0x34 | SUB168(auVar25 * auVar131,8) << 0xc;
          auVar1 = auVar27 * auVar132 + auVar212 + auVar28 * auVar133 + auVar29 * auVar134 +
                   auVar30 * auVar135 + auVar31 * auVar136 + auVar32 * ZEXT816(0x1000003d10);
          uVar237 = auVar1._0_8_;
          auVar213._8_8_ = 0;
          auVar213._0_8_ = uVar237 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_2f8[0].x.n[0];
          auVar137._8_8_ = 0;
          auVar137._0_8_ = local_9e8.z.n[0];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_2f8[0].x.n[1];
          auVar138._8_8_ = 0;
          auVar138._0_8_ = local_9e8.z.n[4];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_2f8[0].x.n[2];
          auVar139._8_8_ = 0;
          auVar139._0_8_ = local_9e8.z.n[3];
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_2f8[0].x.n[3];
          auVar140._8_8_ = 0;
          auVar140._0_8_ = local_9e8.z.n[2];
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_2f8[0].x.n[4];
          auVar141._8_8_ = 0;
          auVar141._0_8_ = local_9e8.z.n[1];
          auVar1 = auVar34 * auVar138 + auVar213 + auVar35 * auVar139 + auVar36 * auVar140 +
                   auVar37 * auVar141;
          uVar235 = auVar1._0_8_;
          auVar215._8_8_ = 0;
          auVar215._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar142._8_8_ = 0;
          auVar142._0_8_ = (uVar235 & 0xfffffffffffff) << 4 | (uVar237 & 0xfffffffffffff) >> 0x30;
          auVar1 = auVar33 * auVar137 + ZEXT816(0x1000003d1) * auVar142;
          uVar235 = auVar1._0_8_;
          local_8c8[0].n[0] = uVar235 & 0xfffffffffffff;
          auVar214._8_8_ = 0;
          auVar214._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_2f8[0].x.n[0];
          auVar143._8_8_ = 0;
          auVar143._0_8_ = local_9e8.z.n[1];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_2f8[0].x.n[1];
          auVar144._8_8_ = 0;
          auVar144._0_8_ = local_9e8.z.n[0];
          auVar40._8_8_ = 0;
          auVar40._0_8_ = local_2f8[0].x.n[2];
          auVar145._8_8_ = 0;
          auVar145._0_8_ = local_9e8.z.n[4];
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_2f8[0].x.n[3];
          auVar146._8_8_ = 0;
          auVar146._0_8_ = local_9e8.z.n[3];
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_2f8[0].x.n[4];
          auVar147._8_8_ = 0;
          auVar147._0_8_ = local_9e8.z.n[2];
          auVar2 = auVar40 * auVar145 + auVar215 + auVar41 * auVar146 + auVar42 * auVar147;
          uVar235 = auVar2._0_8_;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar235 & 0xfffffffffffff;
          auVar1 = auVar38 * auVar143 + auVar214 + auVar39 * auVar144 +
                   auVar43 * ZEXT816(0x1000003d10);
          uVar236 = auVar1._0_8_;
          auVar217._8_8_ = 0;
          auVar217._0_8_ = uVar235 >> 0x34 | auVar2._8_8_ << 0xc;
          local_8c8[0].n[1] = uVar236 & 0xfffffffffffff;
          auVar216._8_8_ = 0;
          auVar216._0_8_ = uVar236 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_2f8[0].x.n[0];
          auVar148._8_8_ = 0;
          auVar148._0_8_ = local_9e8.z.n[2];
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_2f8[0].x.n[1];
          auVar149._8_8_ = 0;
          auVar149._0_8_ = local_9e8.z.n[1];
          auVar46._8_8_ = 0;
          auVar46._0_8_ = local_2f8[0].x.n[2];
          auVar150._8_8_ = 0;
          auVar150._0_8_ = local_9e8.z.n[0];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = local_2f8[0].x.n[3];
          auVar151._8_8_ = 0;
          auVar151._0_8_ = local_9e8.z.n[4];
          auVar48._8_8_ = 0;
          auVar48._0_8_ = local_2f8[0].x.n[4];
          auVar152._8_8_ = 0;
          auVar152._0_8_ = local_9e8.z.n[3];
          auVar2 = auVar47 * auVar151 + auVar217 + auVar48 * auVar152;
          uVar235 = auVar2._0_8_;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = uVar235 & 0xfffffffffffff;
          auVar1 = auVar44 * auVar148 + auVar216 + auVar45 * auVar149 + auVar46 * auVar150 +
                   auVar49 * ZEXT816(0x1000003d10);
          uVar236 = auVar1._0_8_;
          local_8c8[0].n[2] = uVar236 & 0xfffffffffffff;
          auVar218._8_8_ = 0;
          auVar218._0_8_ = (uVar236 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar234 & 0xfffffffffffff);
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar235 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar218 = auVar50 * ZEXT816(0x1000003d10) + auVar218;
          uVar234 = auVar218._0_8_;
          local_8c8[0].n[3] = uVar234 & 0xfffffffffffff;
          local_8c8[0].n[4] = (uVar234 >> 0x34 | auVar218._8_8_ << 0xc) + (uVar237 & 0xffffffffffff)
          ;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_2f8[0].x.n[0];
          auVar153._8_8_ = 0;
          auVar153._0_8_ = local_9e8.x.n[3];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_2f8[0].x.n[1];
          auVar154._8_8_ = 0;
          auVar154._0_8_ = local_9e8.x.n[2];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_2f8[0].x.n[2];
          auVar155._8_8_ = 0;
          auVar155._0_8_ = local_9e8.x.n[1];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = local_2f8[0].x.n[3];
          auVar156._8_8_ = 0;
          auVar156._0_8_ = local_9e8.x.n[0];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_2f8[0].x.n[4];
          auVar157._8_8_ = 0;
          auVar157._0_8_ = local_9e8.x.n[4];
          uVar237 = SUB168(auVar55 * auVar157,0);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar237 & 0xfffffffffffff;
          auVar1 = auVar52 * auVar154 + auVar51 * auVar153 + auVar53 * auVar155 + auVar54 * auVar156
                   + auVar56 * ZEXT816(0x1000003d10);
          uVar234 = auVar1._0_8_;
          auVar219._8_8_ = 0;
          auVar219._0_8_ = uVar234 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = local_2f8[0].x.n[0];
          auVar158._8_8_ = 0;
          auVar158._0_8_ = local_9e8.x.n[4];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = local_2f8[0].x.n[1];
          auVar159._8_8_ = 0;
          auVar159._0_8_ = local_9e8.x.n[3];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = local_2f8[0].x.n[2];
          auVar160._8_8_ = 0;
          auVar160._0_8_ = local_9e8.x.n[2];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = local_2f8[0].x.n[3];
          auVar161._8_8_ = 0;
          auVar161._0_8_ = local_9e8.x.n[1];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = local_2f8[0].x.n[4];
          auVar162._8_8_ = 0;
          auVar162._0_8_ = local_9e8.x.n[0];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar237 >> 0x34 | SUB168(auVar55 * auVar157,8) << 0xc;
          auVar1 = auVar57 * auVar158 + auVar219 + auVar58 * auVar159 + auVar59 * auVar160 +
                   auVar60 * auVar161 + auVar61 * auVar162 + auVar62 * ZEXT816(0x1000003d10);
          uVar237 = auVar1._0_8_;
          auVar220._8_8_ = 0;
          auVar220._0_8_ = uVar237 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar63._8_8_ = 0;
          auVar63._0_8_ = local_2f8[0].x.n[0];
          auVar163._8_8_ = 0;
          auVar163._0_8_ = local_9e8.x.n[0];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = local_2f8[0].x.n[1];
          auVar164._8_8_ = 0;
          auVar164._0_8_ = local_9e8.x.n[4];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = local_2f8[0].x.n[2];
          auVar165._8_8_ = 0;
          auVar165._0_8_ = local_9e8.x.n[3];
          auVar66._8_8_ = 0;
          auVar66._0_8_ = local_2f8[0].x.n[3];
          auVar166._8_8_ = 0;
          auVar166._0_8_ = local_9e8.x.n[2];
          auVar67._8_8_ = 0;
          auVar67._0_8_ = local_2f8[0].x.n[4];
          auVar167._8_8_ = 0;
          auVar167._0_8_ = local_9e8.x.n[1];
          auVar1 = auVar64 * auVar164 + auVar220 + auVar65 * auVar165 + auVar66 * auVar166 +
                   auVar67 * auVar167;
          uVar235 = auVar1._0_8_;
          auVar222._8_8_ = 0;
          auVar222._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar168._8_8_ = 0;
          auVar168._0_8_ = (uVar235 & 0xfffffffffffff) << 4 | (uVar237 & 0xfffffffffffff) >> 0x30;
          auVar1 = auVar63 * auVar163 + ZEXT816(0x1000003d1) * auVar168;
          uVar235 = auVar1._0_8_;
          local_788._0_8_ = uVar235 & 0xfffffffffffff;
          auVar221._8_8_ = 0;
          auVar221._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = local_2f8[0].x.n[0];
          auVar169._8_8_ = 0;
          auVar169._0_8_ = local_9e8.x.n[1];
          auVar69._8_8_ = 0;
          auVar69._0_8_ = local_2f8[0].x.n[1];
          auVar170._8_8_ = 0;
          auVar170._0_8_ = local_9e8.x.n[0];
          auVar70._8_8_ = 0;
          auVar70._0_8_ = local_2f8[0].x.n[2];
          auVar171._8_8_ = 0;
          auVar171._0_8_ = local_9e8.x.n[4];
          auVar71._8_8_ = 0;
          auVar71._0_8_ = local_2f8[0].x.n[3];
          auVar172._8_8_ = 0;
          auVar172._0_8_ = local_9e8.x.n[3];
          auVar72._8_8_ = 0;
          auVar72._0_8_ = local_2f8[0].x.n[4];
          auVar173._8_8_ = 0;
          auVar173._0_8_ = local_9e8.x.n[2];
          auVar2 = auVar70 * auVar171 + auVar222 + auVar71 * auVar172 + auVar72 * auVar173;
          uVar235 = auVar2._0_8_;
          auVar73._8_8_ = 0;
          auVar73._0_8_ = uVar235 & 0xfffffffffffff;
          auVar1 = auVar68 * auVar169 + auVar221 + auVar69 * auVar170 +
                   auVar73 * ZEXT816(0x1000003d10);
          uVar236 = auVar1._0_8_;
          auVar224._8_8_ = 0;
          auVar224._0_8_ = uVar235 >> 0x34 | auVar2._8_8_ << 0xc;
          local_788._8_8_ = uVar236 & 0xfffffffffffff;
          auVar223._8_8_ = 0;
          auVar223._0_8_ = uVar236 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar74._8_8_ = 0;
          auVar74._0_8_ = local_2f8[0].x.n[0];
          auVar174._8_8_ = 0;
          auVar174._0_8_ = local_9e8.x.n[2];
          auVar75._8_8_ = 0;
          auVar75._0_8_ = local_2f8[0].x.n[1];
          auVar175._8_8_ = 0;
          auVar175._0_8_ = local_9e8.x.n[1];
          auVar76._8_8_ = 0;
          auVar76._0_8_ = local_2f8[0].x.n[2];
          auVar176._8_8_ = 0;
          auVar176._0_8_ = local_9e8.x.n[0];
          auVar77._8_8_ = 0;
          auVar77._0_8_ = local_2f8[0].x.n[3];
          auVar177._8_8_ = 0;
          auVar177._0_8_ = local_9e8.x.n[4];
          auVar78._8_8_ = 0;
          auVar78._0_8_ = local_2f8[0].x.n[4];
          auVar178._8_8_ = 0;
          auVar178._0_8_ = local_9e8.x.n[3];
          auVar2 = auVar77 * auVar177 + auVar224 + auVar78 * auVar178;
          uVar235 = auVar2._0_8_;
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar235 & 0xfffffffffffff;
          auVar1 = auVar74 * auVar174 + auVar223 + auVar75 * auVar175 + auVar76 * auVar176 +
                   auVar79 * ZEXT816(0x1000003d10);
          uVar236 = auVar1._0_8_;
          local_9e8.x.n[2] = uVar236 & 0xfffffffffffff;
          auVar225._8_8_ = 0;
          auVar225._0_8_ = (uVar236 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar234 & 0xfffffffffffff);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar235 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar225 = auVar80 * ZEXT816(0x1000003d10) + auVar225;
          uVar234 = auVar225._0_8_;
          local_9e8.x.n[3] = uVar234 & 0xfffffffffffff;
          local_9e8.x.n[4] = (uVar234 >> 0x34 | auVar225._8_8_ << 0xc) + (uVar237 & 0xffffffffffff);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = local_8c8[0].n[0];
          auVar179._8_8_ = 0;
          auVar179._0_8_ = local_9e8.y.n[3];
          auVar82._8_8_ = 0;
          auVar82._0_8_ = local_8c8[0].n[1];
          auVar180._8_8_ = 0;
          auVar180._0_8_ = local_9e8.y.n[2];
          auVar83._8_8_ = 0;
          auVar83._0_8_ = local_8c8[0].n[2];
          auVar181._8_8_ = 0;
          auVar181._0_8_ = local_9e8.y.n[1];
          auVar84._8_8_ = 0;
          auVar84._0_8_ = local_8c8[0].n[3];
          auVar182._8_8_ = 0;
          auVar182._0_8_ = local_9e8.y.n[0];
          auVar85._8_8_ = 0;
          auVar85._0_8_ = local_8c8[0].n[4];
          auVar183._8_8_ = 0;
          auVar183._0_8_ = local_9e8.y.n[4];
          uVar237 = SUB168(auVar85 * auVar183,0);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar237 & 0xfffffffffffff;
          auVar1 = auVar82 * auVar180 + auVar81 * auVar179 + auVar83 * auVar181 + auVar84 * auVar182
                   + auVar86 * ZEXT816(0x1000003d10);
          uVar234 = auVar1._0_8_;
          auVar226._8_8_ = 0;
          auVar226._0_8_ = uVar234 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = local_8c8[0].n[0];
          auVar184._8_8_ = 0;
          auVar184._0_8_ = local_9e8.y.n[4];
          auVar88._8_8_ = 0;
          auVar88._0_8_ = local_8c8[0].n[1];
          auVar185._8_8_ = 0;
          auVar185._0_8_ = local_9e8.y.n[3];
          auVar89._8_8_ = 0;
          auVar89._0_8_ = local_8c8[0].n[2];
          auVar186._8_8_ = 0;
          auVar186._0_8_ = local_9e8.y.n[2];
          auVar90._8_8_ = 0;
          auVar90._0_8_ = local_8c8[0].n[3];
          auVar187._8_8_ = 0;
          auVar187._0_8_ = local_9e8.y.n[1];
          auVar91._8_8_ = 0;
          auVar91._0_8_ = local_8c8[0].n[4];
          auVar188._8_8_ = 0;
          auVar188._0_8_ = local_9e8.y.n[0];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar237 >> 0x34 | SUB168(auVar85 * auVar183,8) << 0xc;
          auVar1 = auVar87 * auVar184 + auVar226 + auVar88 * auVar185 + auVar89 * auVar186 +
                   auVar90 * auVar187 + auVar91 * auVar188 + auVar92 * ZEXT816(0x1000003d10);
          uVar237 = auVar1._0_8_;
          auVar227._8_8_ = 0;
          auVar227._0_8_ = uVar237 >> 0x34 | auVar1._8_8_ << 0xc;
          local_a60.aux = (secp256k1_fe *)(uVar237 & 0xffffffffffff);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = local_8c8[0].n[0];
          auVar189._8_8_ = 0;
          auVar189._0_8_ = local_9e8.y.n[0];
          auVar94._8_8_ = 0;
          auVar94._0_8_ = local_8c8[0].n[1];
          auVar190._8_8_ = 0;
          auVar190._0_8_ = local_9e8.y.n[4];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = local_8c8[0].n[2];
          auVar191._8_8_ = 0;
          auVar191._0_8_ = local_9e8.y.n[3];
          auVar96._8_8_ = 0;
          auVar96._0_8_ = local_8c8[0].n[3];
          auVar192._8_8_ = 0;
          auVar192._0_8_ = local_9e8.y.n[2];
          auVar97._8_8_ = 0;
          auVar97._0_8_ = local_8c8[0].n[4];
          auVar193._8_8_ = 0;
          auVar193._0_8_ = local_9e8.y.n[1];
          auVar1 = auVar94 * auVar190 + auVar227 + auVar95 * auVar191 + auVar96 * auVar192 +
                   auVar97 * auVar193;
          uVar235 = auVar1._0_8_;
          auVar229._8_8_ = 0;
          auVar229._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar194._8_8_ = 0;
          auVar194._0_8_ = (uVar235 & 0xfffffffffffff) << 4 | (uVar237 & 0xfffffffffffff) >> 0x30;
          auVar1 = auVar93 * auVar189 + ZEXT816(0x1000003d1) * auVar194;
          uVar237 = auVar1._0_8_;
          local_788._40_8_ = uVar237 & 0xfffffffffffff;
          auVar228._8_8_ = 0;
          auVar228._0_8_ = uVar237 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar98._8_8_ = 0;
          auVar98._0_8_ = local_8c8[0].n[0];
          auVar195._8_8_ = 0;
          auVar195._0_8_ = local_9e8.y.n[1];
          auVar99._8_8_ = 0;
          auVar99._0_8_ = local_8c8[0].n[1];
          auVar196._8_8_ = 0;
          auVar196._0_8_ = local_9e8.y.n[0];
          auVar100._8_8_ = 0;
          auVar100._0_8_ = local_8c8[0].n[2];
          auVar197._8_8_ = 0;
          auVar197._0_8_ = local_9e8.y.n[4];
          auVar101._8_8_ = 0;
          auVar101._0_8_ = local_8c8[0].n[3];
          auVar198._8_8_ = 0;
          auVar198._0_8_ = local_9e8.y.n[3];
          auVar102._8_8_ = 0;
          auVar102._0_8_ = local_8c8[0].n[4];
          auVar199._8_8_ = 0;
          auVar199._0_8_ = local_9e8.y.n[2];
          auVar2 = auVar100 * auVar197 + auVar229 + auVar101 * auVar198 + auVar102 * auVar199;
          uVar237 = auVar2._0_8_;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = uVar237 & 0xfffffffffffff;
          auVar1 = auVar98 * auVar195 + auVar228 + auVar99 * auVar196 +
                   auVar103 * ZEXT816(0x1000003d10);
          uVar235 = auVar1._0_8_;
          auVar231._8_8_ = 0;
          auVar231._0_8_ = uVar237 >> 0x34 | auVar2._8_8_ << 0xc;
          uStack_758 = uVar235 & 0xfffffffffffff;
          auVar230._8_8_ = 0;
          auVar230._0_8_ = uVar235 >> 0x34 | auVar1._8_8_ << 0xc;
          auVar104._8_8_ = 0;
          auVar104._0_8_ = local_8c8[0].n[0];
          auVar200._8_8_ = 0;
          auVar200._0_8_ = local_9e8.y.n[2];
          auVar105._8_8_ = 0;
          auVar105._0_8_ = local_8c8[0].n[1];
          auVar201._8_8_ = 0;
          auVar201._0_8_ = local_9e8.y.n[1];
          auVar106._8_8_ = 0;
          auVar106._0_8_ = local_8c8[0].n[2];
          auVar202._8_8_ = 0;
          auVar202._0_8_ = local_9e8.y.n[0];
          auVar107._8_8_ = 0;
          auVar107._0_8_ = local_8c8[0].n[3];
          auVar203._8_8_ = 0;
          auVar203._0_8_ = local_9e8.y.n[4];
          auVar108._8_8_ = 0;
          auVar108._0_8_ = local_8c8[0].n[4];
          auVar204._8_8_ = 0;
          auVar204._0_8_ = local_9e8.y.n[3];
          auVar2 = auVar107 * auVar203 + auVar231 + auVar108 * auVar204;
          uVar237 = auVar2._0_8_;
          auVar109._8_8_ = 0;
          auVar109._0_8_ = uVar237 & 0xfffffffffffff;
          auVar1 = auVar104 * auVar200 + auVar230 + auVar105 * auVar201 + auVar106 * auVar202 +
                   auVar109 * ZEXT816(0x1000003d10);
          uVar235 = auVar1._0_8_;
          local_9e8.y.n[2] = uVar235 & 0xfffffffffffff;
          auVar232._8_8_ = 0;
          auVar232._0_8_ = (uVar235 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar234 & 0xfffffffffffff);
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar237 >> 0x34 | auVar2._8_8_ << 0xc;
          auVar232 = auVar110 * ZEXT816(0x1000003d10) + auVar232;
          uVar237 = auVar232._0_8_;
          local_9e8.y.n[3] = uVar237 & 0xfffffffffffff;
          local_9e8.y.n[4] = (long)(local_a60.aux)->n + (uVar237 >> 0x34 | auVar232._8_8_ << 0xc);
          local_738 = 0;
          local_9e8.x.n[0] = local_788._0_8_;
          local_9e8.x.n[1] = local_788._8_8_;
          local_9e8.y.n[0] = local_788._40_8_;
          local_9e8.y.n[1] = uStack_758;
          local_788._16_8_ = local_9e8.x.n[2];
          local_788._24_8_ = local_9e8.x.n[3];
          local_788._32_8_ = local_9e8.x.n[4];
          local_750 = local_9e8.y.n[2];
          uStack_748 = local_9e8.y.n[3];
          local_740 = local_9e8.y.n[4];
          secp256k1_fe_impl_normalize_var((secp256k1_fe *)(local_788 + 0x28));
          if ((local_788._40_8_ & 1) != 0) {
            return 0;
          }
          local_2f8[0].x.n[0] = (local_788._0_8_ - local_a48) + 0x3ffffbfffff0bc;
          local_2f8[0].x.n[1] = (local_788._8_8_ - uStack_a40) + 0x3ffffffffffffc;
          local_2f8[0].x.n[2] = (local_788._16_8_ - local_a38) + 0x3ffffffffffffc;
          local_2f8[0].x.n[3] = (local_788._24_8_ - uStack_a30) + 0x3ffffffffffffc;
          local_2f8[0].x.n[4] = (local_788._32_8_ - local_948.n[4]) + 0x3fffffffffffc;
          iVar233 = secp256k1_fe_impl_normalizes_to_zero_var(&local_2f8[0].x);
          return iVar233;
        }
      }
    }
  }
  else {
    secp256k1_schnorrsig_verify_cold_2();
  }
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal_var(&rx, &r.x);
}